

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external_frame_buffer_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_79f906::ExternalFrameBufferTest_EightJitterBuffers_Test::
~ExternalFrameBufferTest_EightJitterBuffers_Test
          (ExternalFrameBufferTest_EightJitterBuffers_Test *this)

{
  void *in_RDI;
  
  ~ExternalFrameBufferTest_EightJitterBuffers_Test
            ((ExternalFrameBufferTest_EightJitterBuffers_Test *)0x714018);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST_F(ExternalFrameBufferTest, EightJitterBuffers) {
  // Number of buffers equals #AOM_MAXIMUM_REF_BUFFERS +
  // #AOM_MAXIMUM_WORK_BUFFERS + eight jitter buffers.
  const int jitter_buffers = 8;
  const int num_buffers =
      AOM_MAXIMUM_REF_BUFFERS + AOM_MAXIMUM_WORK_BUFFERS + jitter_buffers;
  ASSERT_EQ(AOM_CODEC_OK,
            SetFrameBufferFunctions(num_buffers, get_aom_frame_buffer,
                                    release_aom_frame_buffer));
  ASSERT_EQ(AOM_CODEC_OK, DecodeRemainingFrames());
}